

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O3

void SPARSITY_PREPROC_SYST_CSR(int *colVals,int *rowPtr,int *consP,int NCELLS,int base)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  double *pdVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  double *pdVar10;
  int iVar11;
  long lVar12;
  int k;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  GpuArray<double,_9U> conc;
  Real h_RT [9];
  Real c_R [9];
  Real dcRdT [9];
  double local_708 [9];
  double adStack_6c0 [15];
  undefined1 local_648 [16];
  undefined1 local_638 [16];
  undefined8 local_628;
  double local_618;
  double local_608;
  double local_5f8;
  double local_5e8;
  undefined8 uStack_5e0;
  double local_5d8;
  double local_5c8;
  int *local_5b0;
  double local_5a8;
  double dStack_5a0;
  double local_598;
  double dStack_590;
  double local_588;
  double dStack_580;
  double local_578;
  double dStack_570;
  undefined8 local_568;
  double local_558;
  double dStack_550;
  double local_548;
  undefined8 uStack_540;
  double local_538;
  double dStack_530;
  double local_528;
  undefined8 uStack_520;
  double local_510;
  double local_508;
  double local_500;
  double local_4f8;
  double dStack_4f0;
  double local_4e8;
  double dStack_4e0;
  double dStack_4d8;
  double local_4d0;
  double local_4c8;
  double local_4c0 [2];
  double adStack_4b0 [90];
  double local_1e0;
  double local_1d8;
  undefined8 uStack_1d0;
  double local_1c8;
  undefined8 uStack_1c0;
  double local_1b8;
  undefined8 uStack_1b0;
  double local_1a8;
  undefined8 uStack_1a0;
  double local_198;
  double dStack_190;
  double local_188;
  undefined8 uStack_180;
  double local_178;
  undefined8 uStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  double dStack_150;
  double local_148;
  undefined8 uStack_140;
  double local_138;
  undefined8 uStack_130;
  double local_128 [10];
  double local_d8 [10];
  double local_88;
  double dStack_80;
  double local_78 [9];
  
  adStack_6c0[7] = 0.0;
  adStack_6c0[8] = 0.0;
  adStack_6c0[5] = 0.0;
  adStack_6c0[6] = 0.0;
  adStack_6c0[3] = 0.0;
  adStack_6c0[4] = 0.0;
  adStack_6c0[1] = 0.0;
  adStack_6c0[2] = 0.0;
  adStack_6c0[9] = 0.0;
  lVar4 = 1;
  auVar25 = _DAT_0065b9a0;
  do {
    if (SUB164(auVar25 ^ _DAT_0065b9b0,4) == -0x80000000 &&
        SUB164(auVar25 ^ _DAT_0065b9b0,0) < -0x7ffffff7) {
      adStack_6c0[lVar4] = 0.1111111111111111;
      adStack_6c0[lVar4 + 1] = 0.1111111111111111;
    }
    lVar8 = auVar25._8_8_;
    auVar25._0_8_ = auVar25._0_8_ + 2;
    auVar25._8_8_ = lVar8 + 2;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0xb);
  iVar6 = *consP;
  pdVar10 = &local_4f8;
  lVar4 = 0;
  local_5b0 = rowPtr;
  memset(pdVar10,0,800);
  dVar39 = adStack_6c0[4];
  dVar40 = adStack_6c0[2];
  local_638 = (undefined1  [16])0x0;
  local_648 = (undefined1  [16])0x0;
  adStack_6c0[0xd] = 0.0;
  adStack_6c0[0xe] = 0.0;
  adStack_6c0[0xb] = 0.0;
  adStack_6c0[0xc] = 0.0;
  local_628 = 0;
  dVar36 = 0.0;
  do {
    dVar36 = dVar36 + adStack_6c0[lVar4 + 1];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 9);
  local_5a8 = 2.911342024497792;
  dStack_5a0 = 3.254512984911126;
  local_598 = -15.528347679998124;
  dStack_590 = 19.481084666666668;
  local_588 = 22.009669090999374;
  dStack_580 = 5.94295186894925;
  local_578 = 5.3818731557687505;
  dStack_570 = -5.101694818407498;
  local_568 = 0x4008a2a8a3a0d57d;
  local_5e8 = adStack_6c0[1];
  uStack_5e0 = 0;
  local_5f8 = adStack_6c0[3];
  dVar37 = adStack_6c0[3] * 10.0 + adStack_6c0[2] * -0.21999999999999997 + dVar36 + adStack_6c0[1];
  dVar28 = adStack_6c0[2] * adStack_6c0[4];
  dVar13 = ((dVar37 * 1e-12) / 118698922.25997423) * 1838773899538452.5;
  dVar29 = dVar13 + 1.0;
  local_608 = -0.0006207345732258481 / dVar29;
  dVar14 = log10(dVar13);
  local_618 = exp(-1.5e+33);
  local_618 = local_618 * 0.19999999999999996;
  local_528 = local_618 + 0.8;
  local_5d8 = log10(local_528);
  local_538 = local_5d8 * -1.27 + 0.75;
  dVar14 = local_5d8 * -0.67 + -0.4 + dVar14;
  dVar38 = 1.0 / (dVar14 * -0.14 + local_538);
  local_5c8 = dVar14 * dVar38;
  local_548 = 1.0 / (local_5c8 * local_5c8 + 1.0);
  dVar15 = pow(10.0,local_5d8 * local_548);
  dVar14 = adStack_6c0[8];
  dVar48 = (local_5d8 + local_5d8) * local_548 * local_548 * local_5c8 * dVar38;
  dVar38 = -local_538 * dVar48 * dVar38;
  dVar15 = dVar15 * (dVar13 / dVar29);
  dVar49 = (dVar28 * 118698922.25997423 + adStack_6c0[7] * -11503468.582662737) * dVar15;
  dVar13 = (dVar28 * 47479.56890398969 + adStack_6c0[7] * -130017.75806443932) * dVar15 +
           (dVar38 * -0.0006207345732258481 +
            (dVar48 * local_5c8 * -1.27 + dVar38 * -0.67 + local_548) *
            (local_618 / -1e-30 + -8e-31) * (0.43429448190325176 / local_528) + local_608) *
           2.302585092994046 * dVar49;
  dVar48 = 0.0 - dVar49;
  adStack_6c0[0xc] = dVar48;
  adStack_6c0[0xe] = dVar48;
  local_638._0_8_ = dVar49 + 0.0;
  dVar63 = dVar15 * 118698922.25997423;
  dVar15 = dVar15 * 11503468.582662737;
  dVar38 = (1.0 / dVar29 + dVar38) * (dVar49 / dVar37);
  if (iVar6 == 0) {
    local_708[0] = dVar38 + dVar38;
    local_708[1] = dVar38 * 0.78 + dVar63 * dVar39;
    local_708[2] = dVar38 * 11.0;
    local_708[3] = dVar63 * dVar40 + dVar38;
    local_708[4] = dVar38;
    local_708[5] = dVar38;
    local_708[6] = dVar38 - dVar15;
    local_708[7] = dVar38;
    local_708[8] = dVar38;
    pdVar5 = &dStack_4f0;
    lVar4 = 0;
    do {
      dVar38 = local_708[lVar4];
      *pdVar5 = *pdVar5 - dVar38;
      pdVar5[2] = pdVar5[2] - dVar38;
      pdVar5[5] = dVar38 + pdVar5[5];
      lVar4 = lVar4 + 1;
      pdVar5 = pdVar5 + 10;
    } while (lVar4 != 9);
    uVar46 = SUB84(adStack_4b0[0x54],0);
    uVar47 = (undefined4)((ulong)adStack_4b0[0x54] >> 0x20);
  }
  else {
    dStack_4f0 = 0.0 - dVar38;
    local_4c8 = dVar38 + 0.0;
    dVar29 = dVar38 * -0.21999999999999997 + dVar63 * dVar39;
    adStack_4b0[2] = 0.0 - dVar29;
    adStack_4b0[7] = dVar29 + 0.0;
    adStack_4b0[0xc] = 0.0 - dVar38 * 10.0;
    adStack_4b0[0x11] = dVar38 * 10.0 + 0.0;
    adStack_4b0[0x16] = 0.0 - dVar63 * dVar40;
    adStack_4b0[0x1b] = dVar63 * dVar40 + 0.0;
    adStack_4b0[0x39] = 0.0 - dVar15;
    adStack_4b0[0x34] = dVar15 + 0.0;
    uVar46 = 0;
    uVar47 = 0;
    adStack_4b0[0x52] = 0.0;
    adStack_4b0[0x57] = 0.0;
    dStack_4e0 = dStack_4f0;
    adStack_4b0[4] = adStack_4b0[2];
    adStack_4b0[0xe] = adStack_4b0[0xc];
    adStack_4b0[0x18] = adStack_4b0[0x16];
    adStack_4b0[0x36] = adStack_4b0[0x34];
  }
  dVar38 = adStack_4b0[0x52] - dVar13;
  local_558 = (double)CONCAT44(uVar47,uVar46) - dVar13;
  adStack_4b0[0x57] = adStack_4b0[0x57] + dVar13;
  local_528 = local_5f8 * 11.0 + local_5e8 * 1.5 + dVar36;
  uStack_520 = 0;
  dVar36 = ((local_528 * 1e-06) / 25936106.98548031) * 28231227327.532616;
  adStack_4b0[0x52] = dVar38;
  adStack_4b0[0x54] = local_558;
  dVar13 = log10(dVar36);
  local_608 = exp(-1.5e+33);
  local_608 = local_608 * 0.5;
  local_618 = local_608 + 0.5;
  local_5d8 = log10(local_618);
  local_538 = local_5d8 * -1.27 + 0.75;
  dVar13 = local_5d8 * -0.67 + -0.4 + dVar13;
  dVar15 = 1.0 / (dVar13 * -0.14 + local_538);
  local_5c8 = dVar13 * dVar15;
  local_548 = 1.0 / (local_5c8 * local_5c8 + 1.0);
  dVar13 = pow(10.0,local_5d8 * local_548);
  dVar49 = (local_5d8 + local_5d8) * local_548 * local_548 * local_5c8 * dVar15;
  dVar15 = -local_538 * dVar49 * dVar15;
  dVar37 = dVar36 + 1.0;
  dVar13 = (dVar36 / dVar37) * dVar13;
  dVar29 = (dVar14 * 25936106.98548031 + adStack_6c0[6] * adStack_6c0[6] * -3419315.29664768) *
           dVar13;
  dVar14 = (dVar14 * 280925.8837546357 + adStack_6c0[6] * adStack_6c0[6] * -591.7471466541167) *
           dVar13 + (dVar15 * -0.0002845931413337665 +
                     (dVar49 * local_5c8 * -1.27 + dVar15 * -0.67 + local_548) *
                     (local_608 / -1e-30 + -4.9999999999999995e-31) *
                     (0.43429448190325176 / local_618) + -0.0002845931413337665 / dVar37) *
                    2.302585092994046 * dVar29;
  dVar36 = dVar29 + dVar29 + 0.0;
  local_648._8_8_ = dVar36;
  local_638._8_8_ = 0.0 - dVar29;
  local_708[1] = (1.0 / dVar37 + dVar15) * (dVar29 / local_528);
  dVar15 = dVar13 * 25936106.98548031;
  if (iVar6 == 0) {
    local_708[0] = local_708[1] * 2.5;
    local_708[2] = local_708[1] * 12.0;
    local_708[3] = local_708[1];
    local_708[4] = local_708[1];
    local_708[5] = dVar13 * 3419315.29664768 * -2.0 * adStack_6c0[6] + local_708[1];
    local_708[6] = local_708[1];
    local_708[7] = dVar15 + local_708[1];
    local_708[8] = local_708[1];
    pdVar5 = local_4c0;
    lVar4 = 0;
    do {
      dVar13 = local_708[lVar4];
      pdVar5[-2] = dVar13 + dVar13 + pdVar5[-2];
      *pdVar5 = *pdVar5 - dVar13;
      lVar4 = lVar4 + 1;
      pdVar5 = pdVar5 + 10;
    } while (lVar4 != 9);
  }
  else {
    dVar37 = local_708[1] * 1.5;
    local_4d0 = dVar37 + dVar37 + local_4d0;
    local_4c0[0] = local_4c0[0] - dVar37;
    local_708[1] = local_708[1] * 11.0;
    adStack_4b0[0x10] = local_708[1] + local_708[1] + adStack_4b0[0x10];
    adStack_4b0[0x12] = adStack_4b0[0x12] - local_708[1];
    dVar13 = dVar13 * 3419315.29664768 * -2.0 * adStack_6c0[6];
    adStack_4b0[0x2e] = dVar13 + dVar13 + adStack_4b0[0x2e];
    adStack_4b0[0x30] = adStack_4b0[0x30] - dVar13;
    adStack_4b0[0x42] = dVar15 + dVar15 + adStack_4b0[0x42];
    adStack_4b0[0x44] = adStack_4b0[0x44] - dVar15;
  }
  adStack_4b0[0x56] = dVar14 + dVar14 + adStack_4b0[0x56];
  adStack_4b0[0x58] = adStack_4b0[0x58] - dVar14;
  local_708[1] = local_5e8 * 1.0145869685785861e-06 + dVar39 * dVar39 * -407.1662961015109;
  dVar13 = local_528 * local_708[1];
  dVar14 = (local_5e8 * 2.2738361995042403e-08 + dVar39 * dVar39 * 0.38915785318430907) * local_528;
  adStack_6c0[0xb] = 0.0 - dVar13;
  adStack_6c0[0xe] = dVar13 + dVar13 + dVar48;
  if (iVar6 == 0) {
    local_708[0] = local_708[1] * 2.5 + local_528 * 1.0145869685785861e-06;
    local_708[2] = local_708[1] * 12.0;
    local_708[3] = local_528 * 407.1662961015109 * -2.0 * dVar39 + local_708[1];
    local_708[6] = local_708[1];
    local_708[7] = local_708[1];
    local_708[4] = local_708[1];
    local_708[5] = local_708[1];
    local_708[8] = local_708[1];
    pdVar5 = &local_4f8;
    lVar4 = 0;
    do {
      dVar15 = local_708[lVar4];
      *pdVar5 = *pdVar5 - dVar15;
      pdVar5[3] = dVar15 + dVar15 + pdVar5[3];
      lVar4 = lVar4 + 1;
      pdVar5 = pdVar5 + 10;
      local_558 = adStack_4b0[0x54];
    } while (lVar4 != 9);
  }
  else {
    dVar15 = local_708[1] * 1.5 + local_528 * 1.0145869685785861e-06;
    local_4f8 = 0.0 - dVar15;
    dStack_4e0 = dVar15 + dVar15 + dStack_4e0;
    local_708[1] = local_708[1] * 11.0;
    adStack_4b0[0xb] = 0.0 - local_708[1];
    adStack_4b0[0xe] = local_708[1] + local_708[1] + adStack_4b0[0xe];
    dVar15 = local_528 * 407.1662961015109 * -2.0 * dVar39;
    adStack_4b0[0x15] = 0.0 - dVar15;
    adStack_4b0[0x18] = dVar15 + dVar15 + adStack_4b0[0x18];
    adStack_4b0[0x51] = 0.0;
  }
  adStack_4b0[0x51] = adStack_4b0[0x51] - dVar14;
  adStack_4b0[0x54] = dVar14 + dVar14 + local_558;
  local_708[3] = adStack_6c0[5] * adStack_6c0[5] * 159.17961552912485 +
                 dVar40 * -2.0846475553480232e-08;
  dVar14 = local_528 * local_708[3];
  dVar37 = (adStack_6c0[5] * adStack_6c0[5] * -0.05305987184304161 + dVar40 * -5.456888123885079e-10
           ) * local_528;
  adStack_6c0[0xc] = dVar48 + dVar14;
  dVar49 = local_528 * 159.17961552912485;
  dVar15 = local_528 * 2.0846475553480232e-08;
  if (iVar6 == 0) {
    local_708[0] = local_708[3] * 2.5;
    local_708[1] = local_708[3] - dVar15;
    local_708[2] = local_708[3] * 12.0;
    local_708[4] = (dVar49 + dVar49) * adStack_6c0[5] + local_708[3];
    local_708[7] = local_708[3];
    local_708[8] = local_708[3];
    local_708[5] = local_708[3];
    local_708[6] = local_708[3];
    pdVar5 = &dStack_4f0;
    lVar4 = 0;
    do {
      dVar38 = local_708[lVar4];
      *pdVar5 = *pdVar5 + dVar38;
      pdVar5[3] = pdVar5[3] - (dVar38 + dVar38);
      lVar4 = lVar4 + 1;
      pdVar5 = pdVar5 + 10;
    } while (lVar4 != 9);
  }
  else {
    dVar63 = local_708[3] * 1.5;
    dStack_4f0 = dStack_4f0 + dVar63;
    dStack_4d8 = 0.0 - (dVar63 + dVar63);
    adStack_4b0[2] = adStack_4b0[2] - dVar15;
    adStack_4b0[5] = 0.0 - dVar15 * -2.0;
    local_708[3] = local_708[3] * 11.0;
    adStack_4b0[0xc] = adStack_4b0[0xc] + local_708[3];
    adStack_4b0[0xf] = 0.0 - (local_708[3] + local_708[3]);
    dVar15 = (dVar49 + dVar49) * adStack_6c0[5];
    adStack_4b0[0x20] = adStack_4b0[0x20] + dVar15;
    adStack_4b0[0x23] = 0.0 - (dVar15 + dVar15);
    adStack_4b0[0x55] = 0.0;
    adStack_4b0[0x52] = dVar38;
  }
  dVar38 = adStack_4b0[0x52] + dVar37;
  adStack_4b0[0x52] = dVar38;
  adStack_4b0[0x55] = adStack_4b0[0x55] - (dVar37 + dVar37);
  local_708[1] = dVar39 * adStack_6c0[5] * 3142.6666666666665 +
                 adStack_6c0[6] * -5.646680545093694e-06;
  local_648._8_8_ = local_528 * local_708[1];
  dVar15 = (dVar39 * adStack_6c0[5] * -2.095111111111111 + adStack_6c0[6] * -1.262891468371164e-07)
           * local_528;
  adStack_6c0[0xe] = adStack_6c0[0xe] - (double)local_648._8_8_;
  local_648._0_8_ = (0.0 - (dVar14 + dVar14)) - (double)local_648._8_8_;
  local_648._8_8_ = (double)local_648._8_8_ + dVar36;
  dVar37 = local_528 * 3142.6666666666665;
  dVar36 = local_528 * 5.646680545093694e-06;
  if (iVar6 == 0) {
    local_708[0] = local_708[1] * 2.5;
    local_708[2] = local_708[1] * 12.0;
    local_708[3] = local_708[1] + adStack_6c0[5] * dVar37;
    local_708[4] = local_708[1] + dVar39 * dVar37;
    local_708[5] = local_708[1] - dVar36;
    local_708[6] = local_708[1];
    local_708[7] = local_708[1];
    local_708[8] = local_708[1];
    pdVar5 = &local_4d0;
    lVar4 = 0;
    do {
      dVar36 = local_708[lVar4];
      pdVar5[-2] = pdVar5[-2] - dVar36;
      pdVar5[-1] = pdVar5[-1] - dVar36;
      *pdVar5 = dVar36 + *pdVar5;
      lVar4 = lVar4 + 1;
      pdVar5 = pdVar5 + 10;
    } while (lVar4 != 9);
  }
  else {
    dVar49 = local_708[1] * 1.5;
    dStack_4e0 = dStack_4e0 - dVar49;
    dStack_4d8 = dStack_4d8 - dVar49;
    local_4d0 = dVar49 + local_4d0;
    local_708[1] = local_708[1] * 11.0;
    adStack_4b0[0xe] = adStack_4b0[0xe] - local_708[1];
    adStack_4b0[0xf] = adStack_4b0[0xf] - local_708[1];
    adStack_4b0[0x10] = local_708[1] + adStack_4b0[0x10];
    dVar49 = dVar37 * adStack_6c0[5];
    adStack_4b0[0x18] = adStack_4b0[0x18] - dVar49;
    adStack_4b0[0x19] = adStack_4b0[0x19] - dVar49;
    adStack_4b0[0x1a] = dVar49 + adStack_4b0[0x1a];
    dVar37 = dVar37 * dVar39;
    adStack_4b0[0x22] = adStack_4b0[0x22] - dVar37;
    adStack_4b0[0x23] = adStack_4b0[0x23] - dVar37;
    adStack_4b0[0x24] = dVar37 + adStack_4b0[0x24];
    adStack_4b0[0x2c] = dVar36 + adStack_4b0[0x2c];
    adStack_4b0[0x2d] = dVar36 + adStack_4b0[0x2d];
    adStack_4b0[0x2e] = adStack_4b0[0x2e] - dVar36;
  }
  adStack_4b0[0x54] = adStack_4b0[0x54] - dVar15;
  dVar63 = adStack_4b0[0x55] - dVar15;
  adStack_4b0[0x55] = dVar63;
  adStack_4b0[0x56] = dVar15 + adStack_4b0[0x56];
  dVar15 = dVar39 * adStack_6c0[6];
  local_708[1] = dVar15 * 16888.888888888887 + local_5f8 * -1.4321870058604512e-06;
  dVar36 = local_528 * local_708[1];
  dVar37 = (dVar15 * -22.518518518518515 + local_5f8 * -3.623660767668382e-08) * local_528;
  adStack_6c0[0xe] = adStack_6c0[0xe] - dVar36;
  local_648._8_8_ = (double)local_648._8_8_ - dVar36;
  adStack_6c0[0xd] = dVar36 + 0.0;
  dVar49 = local_528 * 16888.888888888887;
  if (iVar6 == 0) {
    local_708[0] = local_708[1] * 2.5;
    local_708[2] = -(local_528 * 1.4321870058604512e-06) + local_708[1] * 12.0;
    local_708[3] = local_708[1] + adStack_6c0[6] * dVar49;
    local_708[4] = local_708[1];
    local_708[5] = dVar49 * dVar39 + local_708[1];
    local_708[6] = local_708[1];
    local_708[7] = local_708[1];
    local_708[8] = local_708[1];
    pdVar5 = &local_4e8;
    lVar4 = 0;
    do {
      dVar49 = local_708[lVar4];
      *pdVar5 = *pdVar5 + dVar49;
      pdVar5[1] = pdVar5[1] - dVar49;
      pdVar5[3] = pdVar5[3] - dVar49;
      lVar4 = lVar4 + 1;
      pdVar5 = pdVar5 + 10;
    } while (lVar4 != 9);
  }
  else {
    dVar16 = local_708[1] * 1.5;
    local_4e8 = dVar16 + 0.0;
    dStack_4e0 = dStack_4e0 - dVar16;
    local_4d0 = local_4d0 - dVar16;
    dVar16 = local_708[1] * 11.0 - local_528 * 1.4321870058604512e-06;
    adStack_4b0[0xd] = dVar16 + 0.0;
    adStack_4b0[0xe] = adStack_4b0[0xe] - dVar16;
    adStack_4b0[0x10] = adStack_4b0[0x10] - dVar16;
    dVar16 = dVar49 * adStack_6c0[6];
    adStack_4b0[0x17] = dVar16 + 0.0;
    adStack_4b0[0x18] = adStack_4b0[0x18] - dVar16;
    adStack_4b0[0x1a] = adStack_4b0[0x1a] - dVar16;
    dVar49 = dVar49 * dVar39;
    adStack_4b0[0x2b] = dVar49 + 0.0;
    adStack_4b0[0x2c] = adStack_4b0[0x2c] - dVar49;
    adStack_4b0[0x2e] = adStack_4b0[0x2e] - dVar49;
    adStack_4b0[0x53] = 0.0;
  }
  dVar71 = dVar28 * 694956.7634748495 + adStack_6c0[5] * adStack_6c0[6] * -9534710.169227276;
  dVar28 = dVar28 * 2391.8538305613447 + adStack_6c0[5] * adStack_6c0[6] * 345.9681317415751;
  dVar39 = dVar39 * 694956.7634748495;
  dVar40 = dVar40 * 694956.7634748495;
  dVar67 = adStack_6c0[5] * -9534710.169227276;
  dStack_530 = (adStack_4b0[0x54] - dVar37) - dVar28;
  dVar72 = adStack_6c0[5] * 1860366.9115799016;
  dStack_4d8 = dStack_4d8 - dVar72;
  dVar70 = adStack_6c0[6] * -1341454.8115373214;
  adStack_4b0[0x19] = (adStack_4b0[0x19] + dVar40) - dVar70;
  dVar30 = adStack_6c0[1] * 1860366.9115799016;
  dVar35 = adStack_6c0[6] * -9534710.169227276;
  adStack_4b0[0x1f] = adStack_4b0[0x1f] - dVar30;
  adStack_4b0[0x22] = (adStack_4b0[0x22] - dVar35) + dVar30;
  dVar55 = adStack_6c0[6] * 4271828.084344627;
  local_4e8 = dVar55 + local_4e8;
  local_4d0 = (dVar72 + local_4d0) - dVar55;
  dVar17 = adStack_6c0[3] * -145376.75098299314;
  dVar50 = adStack_6c0[4] * -1341454.8115373214;
  dVar56 = adStack_6c0[4] * -145376.75098299314;
  dVar60 = adStack_6c0[5] * 86324.17110758815;
  adStack_4b0[0xb] = adStack_4b0[0xb] - dVar56;
  dVar41 = adStack_6c0[1] * 4271828.084344627;
  adStack_4b0[0x29] = (adStack_4b0[0x29] - dVar50) - dVar41;
  adStack_4b0[0xf] = adStack_4b0[0xf] - dVar60;
  dVar57 = adStack_6c0[3] * 86324.17110758815;
  adStack_4b0[0x21] = adStack_4b0[0x21] - dVar57;
  dVar42 = adStack_6c0[6] * -3658126.0115307234;
  dVar43 = adStack_6c0[1] * adStack_6c0[6] * 7577.3366907946565 +
           (0.0017737925172045287 -
           ((dStack_590 + local_598) - (dStack_580 + local_5a8)) * 0.0006666666666666666) *
           -145376.75098299314 * adStack_6c0[4] * adStack_6c0[3];
  dVar45 = local_5e8 * adStack_6c0[5] * 5928.561733942619 +
           (0.0031867701457385282 -
           ((dStack_580 + dStack_590) - (local_588 + local_5a8)) * 0.0006666666666666666) *
           -1341454.8115373214 * dVar15;
  dVar31 = adStack_6c0[2] * -0.32384379658070717;
  dStack_4f0 = dVar31 + dStack_4f0;
  dVar18 = adStack_6c0[7] * 12595057.621245861;
  adStack_4b0[0x16] = dVar18 + (adStack_4b0[0x16] - dVar40);
  dVar49 = adStack_6c0[4] * 12595057.621245861;
  dVar16 = adStack_6c0[7] * 64119709.90701692;
  uStack_540 = 0;
  dVar75 = adStack_6c0[6] * -0.6025543492746578;
  dVar61 = adStack_6c0[6] * -32.62001221218423;
  dVar62 = adStack_6c0[2] * -0.6025543492746578;
  adStack_4b0[5] = (dVar39 + adStack_4b0[5]) - dVar75;
  dVar58 = adStack_6c0[7] * 32500000.0;
  adStack_4b0[0x20] = (adStack_4b0[0x20] - dVar35) + dVar58;
  local_198 = (((adStack_4b0[0x2d] + dVar67) - dVar50) - dVar42) - dVar62;
  dVar51 = adStack_6c0[4] * 64119709.90701692;
  dVar54 = adStack_6c0[5] * 32500000.0;
  dVar74 = adStack_6c0[7] * adStack_6c0[4];
  dVar32 = dVar74 * 12595057.621245861 + adStack_6c0[1] * adStack_6c0[2] * -0.32384379658070717;
  dVar33 = dVar74 * 2318.3152480739177 +
           (0.00018406547375879315 -
           ((local_5a8 + dStack_5a0) - (dStack_590 + local_578)) * 0.0006666666666666666) *
           -0.32384379658070717 * adStack_6c0[1] * adStack_6c0[2];
  dVar19 = dVar74 * 4230.445091721601 +
           (6.597729618328551e-05 -
           ((dStack_580 + dStack_580) - (dStack_590 + local_578)) * 0.0006666666666666666) *
           -16.310006106092114 * adStack_6c0[6] * adStack_6c0[6];
  dVar26 = adStack_6c0[5] * adStack_6c0[7] * 0.0 +
           (0.0 - ((dStack_580 + dStack_5a0) - (local_578 + local_588)) * 0.0006666666666666666) *
           -0.6025543492746578 * adStack_6c0[6] * adStack_6c0[2];
  dVar73 = adStack_6c0[7] * adStack_6c0[6] * 34143562.115192875 +
           adStack_6c0[2] * adStack_6c0[3] * -0.029876205886692417;
  dVar77 = adStack_6c0[7] * adStack_6c0[6] * -3795.2266287524203 +
           (-0.00011115497017997593 -
           ((dStack_5a0 + local_598) - (dStack_580 + local_578)) * 0.0006666666666666666) *
           -0.029876205886692417 * adStack_6c0[2] * adStack_6c0[3];
  dVar64 = adStack_6c0[3] * -0.029876205886692417;
  dVar66 = adStack_6c0[1] * -0.32384379658070717;
  adStack_4b0[1] = dVar66 + adStack_4b0[1];
  adStack_4b0[3] = adStack_4b0[3] + dVar64;
  adStack_4b0[4] = (adStack_4b0[4] - dVar39) - dVar66;
  adStack_4b0[6] = (dVar39 + adStack_4b0[6] + dVar75) - dVar64;
  auVar1._8_4_ = SUB84(adStack_4b0[7] - dVar66,0);
  auVar1._0_8_ = adStack_4b0[6];
  auVar1._12_4_ = (int)((ulong)(adStack_4b0[7] - dVar66) >> 0x20);
  adStack_4b0[7] = auVar1._8_8_;
  dVar20 = adStack_6c0[2] * -0.029876205886692417;
  adStack_4b0[0xc] = adStack_4b0[0xc] + dVar20;
  dVar53 = adStack_6c0[7] * 15085094.926858293;
  dVar21 = adStack_6c0[7] * 34143562.115192875;
  local_168 = ((adStack_4b0[0x2f] - dVar61) - dVar62) - dVar21;
  adStack_4b0[0x2a] = (adStack_4b0[0x2a] - dVar67) + dVar62 + dVar21;
  dVar34 = adStack_6c0[6] * 34143562.115192875;
  dVar65 = adStack_6c0[8] * -4.470666408692084;
  local_148 = adStack_6c0[1] * adStack_6c0[7];
  uStack_140 = 0;
  dVar22 = adStack_6c0[7] * -4323.663734083463;
  dStack_160 = adStack_6c0[6];
  local_88 = adStack_6c0[6];
  dStack_80 = adStack_6c0[8];
  dVar52 = adStack_6c0[8] * -150.1634478502138;
  dVar23 = adStack_6c0[2] * -150.1634478502138;
  dVar27 = adStack_6c0[8] * adStack_6c0[2];
  dVar76 = adStack_6c0[7] * adStack_6c0[7];
  dVar24 = dVar76 * 20212.492175153773 +
           (0.0026797964842987356 -
           ((dStack_5a0 + dStack_570) - (local_578 + local_578)) * 0.0006666666666666666) *
           -150.1634478502138 * dVar27;
  uStack_180 = 0;
  dVar44 = dVar76 * 7542547.463429146 + dVar27 * -150.1634478502138;
  adStack_4b0[2] = dVar66 + (adStack_4b0[2] - dVar39) + dVar75 + dVar64 + dVar52 + dVar65;
  adStack_4b0[7] = (((adStack_4b0[7] - dVar75) - dVar64) - (dVar52 + dVar52)) - (dVar65 + dVar65);
  adStack_4b0[8] = dVar65 + dVar52 + adStack_4b0[8];
  dVar66 = adStack_6c0[1] * adStack_6c0[6] * 4271828.084344627 +
           adStack_6c0[4] * adStack_6c0[3] * -145376.75098299314;
  dVar75 = local_5e8 * adStack_6c0[5] * 1860366.9115799016 + dVar15 * -1341454.8115373214;
  dVar52 = adStack_6c0[5] * adStack_6c0[3] * 374.95779706744673 +
           (0.00434360147634811 -
           (dStack_580 * 2.0 + -(local_588 + local_598)) * 0.0006666666666666666) *
           -1829063.0057653617 * adStack_6c0[6] * adStack_6c0[6];
  dVar65 = dVar76 * -81.82756742036453 +
           (-0.0003643959615980579 -
           (local_578 * -2.0 + dStack_5a0 + dStack_570) * 0.0006666666666666666) *
           -4.470666408692084 * dVar27;
  local_548 = dVar65 * -2.0 +
              (((((adStack_4b0[0x57] - dVar33) - dVar19) - dVar26) - dVar77) - (dVar24 + dVar24));
  dVar64 = dVar74 * 64119709.90701692 + adStack_6c0[6] * adStack_6c0[6] * -16.310006106092114;
  dStack_550 = adStack_6c0[5] * adStack_6c0[7] * 32500000.0 +
               adStack_6c0[6] * adStack_6c0[2] * -0.6025543492746578;
  dVar68 = adStack_6c0[5] * adStack_6c0[3] * 86324.17110758815 +
           adStack_6c0[6] * adStack_6c0[6] * -1829063.0057653617;
  dVar69 = dVar76 * 224556.7351007675 + dVar27 * -4.470666408692084;
  local_538 = dVar69 * -2.0 +
              ((((((double)local_638._0_8_ - dVar32) - dVar64) - dStack_550) - dVar73) -
              (dVar44 + dVar44));
  dVar39 = adStack_6c0[7] * 449113.470201535;
  adStack_4b0[0x34] = dVar49 + adStack_4b0[0x34] + dVar54 + dVar34 + dVar53 + dVar39;
  dVar27 = adStack_6c0[6] * -7.112730406981104e-05;
  adStack_4b0[0xe] = (adStack_4b0[0xe] + dVar56) - dVar27;
  dVar59 = adStack_6c0[8] * 6362141.693962547;
  adStack_4b0[0x17] = dVar17 + adStack_4b0[0x17] + dVar59;
  adStack_4b0[0x1a] = dVar16 + dVar16 + ((dVar70 + dVar40 + adStack_4b0[0x1a]) - dVar17) + dVar59;
  local_1a8 = adStack_6c0[3];
  uStack_1a0 = 0;
  dVar74 = adStack_6c0[3] * -7.112730406981104e-05;
  adStack_4b0[0x2c] = (((adStack_4b0[0x2c] - dVar67) + dVar50 + dVar41) - dVar61) - dVar74;
  local_1c8 = adStack_6c0[4];
  uStack_1c0 = 0;
  adStack_6c0[2] = adStack_6c0[2] * -4.470666408692084;
  dVar76 = adStack_6c0[4] * 6362141.693962547;
  adStack_4b0[0x3e] = adStack_4b0[0x3e] + dVar23 + adStack_6c0[2];
  local_4f8 = dVar31 + ((local_4f8 - dVar72) - dVar55) + dVar22;
  dStack_4e0 = ((dVar55 + dStack_4e0 + dVar72) - dVar31) - dVar22;
  local_4c8 = (local_4c8 - dVar31) + dVar22;
  local_4c0[0] = local_4c0[0] - dVar22;
  dVar15 = adStack_6c0[8] * 3347824.3674030215;
  local_178 = adStack_6c0[8];
  uStack_170 = 0;
  adStack_4b0[0x15] = dVar18 + ((adStack_4b0[0x15] - dVar70) - dVar17) + dVar15;
  adStack_4b0[0x18] =
       ((((dVar17 + (adStack_4b0[0x18] - dVar40) + dVar70) - dVar18) - dVar16) - dVar59) - dVar15;
  adStack_4b0[0x1b] = dVar15 + ((adStack_4b0[0x1b] - dVar18) - dVar16);
  adStack_4b0[0x1c] = (adStack_4b0[0x1c] - dVar59) - dVar15;
  local_1b8 = local_5a8 + local_578;
  uStack_1b0 = 0;
  local_138 = dStack_570;
  uStack_130 = 0;
  local_1d8 = dStack_580;
  uStack_1d0 = 0;
  dVar40 = adStack_6c0[8] * 5672469.694980093;
  adStack_4b0[0x23] = ((((dVar35 + adStack_4b0[0x23]) - dVar30) - dVar57) - dVar58) - dVar40;
  adStack_4b0[0x24] = dVar40 + dVar57 + dVar57 + dVar30 + dVar35 + adStack_4b0[0x24] + dVar58;
  adStack_4b0[0x25] = dVar40 + (adStack_4b0[0x25] - dVar58);
  adStack_4b0[0x26] = adStack_4b0[0x26] - dVar40;
  adStack_6c0[1] = adStack_6c0[1] * -4323.663734083463;
  dVar40 = adStack_6c0[6] * -5282.492258864639;
  local_500 = adStack_4b0[0x30] - dVar74;
  adStack_4b0[0x33] = dVar49 + adStack_4b0[0x33] + adStack_6c0[1];
  adStack_4b0[0x36] = ((adStack_4b0[0x36] - dVar49) - dVar51) - adStack_6c0[1];
  adStack_4b0[0x37] = (adStack_4b0[0x37] - dVar54) - dVar40;
  dVar16 = adStack_6c0[4] * 3347824.3674030215;
  dVar17 = adStack_6c0[5] * 5672469.694980093;
  adStack_4b0[0x3d] = adStack_4b0[0x3d] + dVar16;
  local_528 = adStack_6c0[5] * adStack_6c0[8] * 5672469.694980093 +
              adStack_6c0[7] * adStack_6c0[6] * -5282.492258864639;
  local_158 = adStack_6c0[5] * adStack_6c0[8] * 12599.866574880663 +
              (0.0022212311836643283 -
              ((local_578 + dStack_580) - (local_588 + dStack_570)) * 0.0006666666666666666) *
              -5282.492258864639 * adStack_6c0[7] * adStack_6c0[6];
  dStack_150 = adStack_6c0[5];
  local_558 = (dVar64 + dVar64 +
               dVar68 * 2.0 + ((dVar75 + dVar71 + (double)local_648._8_8_) - dVar66) + dStack_550) -
              dVar73;
  adStack_4b0[0x40] = (adStack_4b0[0x40] - dVar76) - dVar16;
  adStack_4b0[0x41] = adStack_4b0[0x41] - dVar17;
  adStack_4b0[0x55] = ((((dVar63 + dVar28) - dVar45) - dVar52) - dVar26) - local_158;
  dVar18 = adStack_6c0[3] * -43.95116952269832;
  local_188 = (((dVar51 + dVar51 + adStack_4b0[0x38] + dVar54) - dVar34) + dVar40) - dVar18;
  local_510 = ((((((adStack_4b0[0x39] - dVar49) - dVar51) - dVar54) - dVar34) - (dVar53 + dVar53)) -
              (dVar39 + dVar39)) + adStack_6c0[1] + dVar40 + dVar18;
  local_508 = (((dVar39 + dVar53 + adStack_4b0[0x3a]) - adStack_6c0[1]) - dVar40) - dVar18;
  dVar63 = adStack_6c0[8] * 1000000.0;
  dVar39 = adStack_6c0[6] * 1000000.0;
  dVar15 = adStack_6c0[7] * -5282.492258864639;
  dVar49 = adStack_6c0[8] * 23496864.50220335;
  dStack_190 = (((dVar61 + dVar61 +
                  dVar42 + dVar42 + ((dVar50 + dVar67 + adStack_4b0[0x2e]) - dVar41) + dVar62) -
                dVar21) + dVar74 + dVar15) - dVar63;
  dVar53 = adStack_6c0[7] * -1032.714674988212;
  dVar40 = adStack_6c0[7] * -43.95116952269832;
  adStack_4b0[0xd] = ((adStack_4b0[0xd] + dVar56) - dVar60) + dVar20 + dVar27 + dVar40 + dVar53;
  adStack_4b0[0x10] =
       ((((dVar60 + dVar60 + (adStack_4b0[0x10] - dVar56)) - dVar20) + dVar27) - dVar40) - dVar53;
  adStack_4b0[0x11] = dVar40 + (adStack_4b0[0x11] - dVar20) + dVar53;
  adStack_4b0[0x12] = ((adStack_4b0[0x12] - dVar27) - dVar40) - dVar53;
  adStack_4b0[0x2b] = ((adStack_4b0[0x2b] + dVar41) - dVar42) + dVar21 + dVar74 + dVar63 + dVar49;
  adStack_4b0[0x2d] = local_198 - dVar15;
  adStack_4b0[0x2e] = dStack_190 - dVar49;
  adStack_4b0[0x2f] = local_168 + dVar15 + dVar63 + dVar49;
  dVar40 = adStack_6c0[3] * -1032.714674988212;
  adStack_4b0[0x30] = (((adStack_4b0[0x30] - dVar74) - dVar15) - dVar63) - dVar49;
  adStack_4b0[0x35] = adStack_4b0[0x35] + dVar34 + dVar18 + dVar40;
  adStack_4b0[0x38] = local_188 - dVar40;
  adStack_4b0[0x39] = local_510 + dVar40;
  adStack_4b0[0x3a] = local_508 - dVar40;
  dVar40 = adStack_6c0[6] * 23496864.50220335;
  adStack_4b0[0x3f] = adStack_4b0[0x3f] + dVar76 + dVar39 + dVar40;
  adStack_4b0[0x42] = ((adStack_4b0[0x42] + dVar76 + dVar17) - dVar39) - dVar40;
  adStack_4b0[0x43] =
       ((adStack_4b0[0x43] - (dVar23 + dVar23)) - (adStack_6c0[2] + adStack_6c0[2])) + dVar16 +
       dVar17 + dVar39 + dVar40;
  adStack_4b0[0x44] =
       (((((dVar23 + adStack_4b0[0x44] + adStack_6c0[2]) - dVar76) - dVar16) - dVar17) - dVar39) -
       dVar40;
  adStack_6c0[7] = adStack_6c0[3] * adStack_6c0[7];
  dVar15 = adStack_6c0[6] * adStack_6c0[8] * 0.0 +
           (0.0 - ((local_578 + local_598) - (dStack_570 + dStack_580)) * 0.0006666666666666666) *
           -43.95116952269832 * adStack_6c0[7];
  dVar63 = adStack_6c0[8] * adStack_6c0[4] * 5648.9319335705395 +
           (0.0008878978503309949 -
           ((local_598 + dStack_580) - (dStack_570 + dStack_590)) * 0.0006666666666666666) *
           -7.112730406981104e-05 * adStack_6c0[6] * adStack_6c0[3];
  adStack_4b0[0x52] = dVar65 + dVar24 + dVar33 + (dVar38 - dVar28) + dVar26 + dVar77;
  dVar39 = adStack_6c0[6] * adStack_6c0[8] * 50223.15555469926 +
           (0.0021374407444869816 -
           ((local_578 + local_598) - (dStack_580 + dStack_570)) * 0.0006666666666666666) *
           -1032.714674988212 * adStack_6c0[7];
  dVar38 = adStack_6c0[8] * adStack_6c0[4] * 5952.53958938735 +
           (0.0017780322191766774 -
           ((local_5a8 + local_578) - (dStack_570 + dStack_590)) * 0.0006666666666666666) *
           -4323.663734083463 * local_148;
  adStack_4b0[0x51] = dVar33 + ((adStack_4b0[0x51] - dVar45) - dVar43) + dVar38;
  dVar49 = adStack_6c0[6] * adStack_6c0[8] * 1000000.0 + adStack_6c0[7] * -43.95116952269832;
  dVar16 = adStack_6c0[8] * adStack_6c0[4] * 6362141.693962547 +
           adStack_6c0[6] * adStack_6c0[3] * -7.112730406981104e-05;
  adStack_6c0[0xc] = dVar32 + ((dVar48 + dVar14) - dVar71) + dStack_550 + dVar73 + dVar44 + dVar69;
  dVar40 = dVar73 + ((dVar36 + 0.0 + dVar66) - dVar68) + dVar16;
  auVar2._8_4_ = SUB84(dVar40,0);
  auVar2._0_8_ = adStack_6c0[0xc];
  auVar2._12_4_ = (int)((ulong)dVar40 >> 0x20);
  adStack_6c0[0xd] = auVar2._8_8_;
  dVar36 = adStack_6c0[6] * adStack_6c0[8] * 23496864.50220335 + adStack_6c0[7] * -1032.714674988212
  ;
  dVar14 = adStack_6c0[8] * adStack_6c0[4] * 3347824.3674030215 + local_148 * -4323.663734083463;
  adStack_6c0[0xb] = dVar32 + (((0.0 - dVar13) - dVar75) - dVar66) + dVar14;
  adStack_6c0[0xd] = adStack_6c0[0xd] + dVar49 + dVar36;
  dVar40 = ((((dVar66 + (adStack_6c0[0xe] - dVar71) + dVar75) - dVar32) - dVar64) - dVar16) - dVar14
  ;
  auVar3._8_4_ = SUB84(dVar40,0);
  auVar3._0_8_ = adStack_6c0[0xd];
  auVar3._12_4_ = (int)((ulong)dVar40 >> 0x20);
  adStack_6c0[0xe] = auVar3._8_8_;
  local_648._8_8_ = ((local_558 + dVar16 + local_528) - dVar49) - dVar36;
  local_648._0_8_ =
       (((((double)local_648._0_8_ + dVar71) - dVar75) - dVar68) - dStack_550) - local_528;
  local_638._8_8_ =
       (((((dVar69 + (0.0 - dVar29) + dVar44) - dVar16) - dVar14) - local_528) - dVar49) - dVar36;
  local_638._0_8_ = local_538 + dVar14 + local_528 + dVar49 + dVar36;
  adStack_4b0[0x53] =
       dVar63 + dVar77 + ((adStack_4b0[0x53] + dVar37 + dVar43) - dVar52) + dVar15 + dVar39;
  adStack_4b0[0x54] = ((((dVar43 + dStack_530 + dVar45) - dVar33) - dVar19) - dVar63) - dVar38;
  adStack_4b0[0x56] =
       ((((dVar19 + dVar19 +
           dVar52 * 2.0 + ((dVar45 + dVar28 + (adStack_4b0[0x56] - dVar37)) - dVar43) + dVar26) -
         dVar77) + dVar63 + local_158) - dVar15) - dVar39;
  adStack_4b0[0x57] = local_548 + dVar38 + local_158 + dVar15 + dVar39;
  adStack_4b0[0x58] =
       (((((dVar65 + adStack_4b0[0x58] + dVar24) - dVar63) - dVar38) - local_158) - dVar15) - dVar39
  ;
  if (iVar6 == 0) {
    local_128[0] = 2.8916149455543745;
    local_128[1] = 3.3887808219431252;
    local_128[2] = 4.665255136408125;
    local_128[3] = 1.5;
    local_128[4] = 1.506900950283125;
    local_128[5] = 2.9628176357525002;
    local_128[6] = 5.2821630604062495;
    local_128[7] = 7.4795990834;
    local_128[8] = 3.1861205355625004;
    local_d8[0] = 0.00049010354654;
    local_d8[1] = 0.000340356715215;
    local_d8[2] = 0.0011616005819375;
    local_d8[3] = 0.0;
    local_d8[4] = -1.20361935e-05;
    local_d8[5] = 0.00046729736768999996;
    local_d8[6] = 0.0009643321552500001;
    local_d8[7] = 0.0013043066091500003;
    local_d8[8] = 0.00037292866150000014;
    pdVar5 = local_78;
    local_78[0] = 1.9113420244977917;
    local_78[1] = 2.254512984911125;
    local_78[2] = -16.528347679998124;
    local_78[3] = 18.481084666666668;
    local_78[4] = 21.009669090999374;
    local_78[5] = 4.94295186894925;
    local_78[6] = 4.3818731557687505;
    local_78[7] = -6.101694818407498;
    local_78[8] = 2.079423216195834;
  }
  else {
    local_128[0] = 3.8916149455543745;
    local_128[1] = 4.388780821943126;
    local_128[2] = 5.665255136408124;
    local_128[3] = 2.5;
    local_128[4] = 2.506900950283125;
    local_128[5] = 3.9628176357525002;
    local_128[6] = 6.28216306040625;
    local_128[7] = 8.4795990834;
    local_128[8] = 4.1861205355625;
    local_d8[0] = 0.00049010354654;
    local_d8[1] = 0.000340356715215;
    local_d8[2] = 0.0011616005819375;
    local_d8[3] = 0.0;
    local_d8[4] = -1.20361935e-05;
    local_d8[5] = 0.00046729736768999996;
    local_d8[6] = 0.0009643321552500001;
    local_d8[7] = 0.0013043066091500003;
    local_d8[8] = 0.00037292866150000014;
    pdVar5 = &local_5a8;
  }
  dVar39 = 0.0;
  dVar36 = 0.0;
  dVar40 = 0.0;
  lVar4 = 0;
  dVar38 = 0.0;
  do {
    dVar14 = *(double *)((long)adStack_6c0 + lVar4 + 8);
    dVar38 = dVar38 + *(double *)((long)local_128 + lVar4) * dVar14;
    dVar13 = *(double *)((long)pdVar5 + lVar4);
    dVar15 = *(double *)((long)adStack_6c0 + lVar4 + 0x58);
    dVar39 = dVar39 + dVar14 * *(double *)((long)local_d8 + lVar4);
    dVar36 = dVar36 + dVar15 * dVar13;
    dVar40 = dVar40 + (*(double *)((long)local_128 + lVar4) - dVar13) * 0.0006666666666666666 *
                      dVar15 + dVar13 * *(double *)((long)adStack_4b0 + lVar4 + 0x288);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x48);
  dVar36 = dVar36 * (1.0 / dVar38);
  dVar14 = (1.0 / dVar38) * 1500.0;
  dVar38 = dVar36 * dVar14;
  dVar14 = -dVar14;
  lVar4 = 0;
  do {
    dVar13 = 0.0;
    lVar8 = 0;
    do {
      dVar13 = dVar13 + pdVar5[lVar8] * pdVar10[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 9);
    adStack_4b0[lVar4 * 10] = local_128[lVar4] * dVar38 + dVar13 * dVar14;
    lVar4 = lVar4 + 1;
    pdVar10 = pdVar10 + 10;
  } while (lVar4 != 9);
  local_1e0 = dVar14 * dVar40 + (dVar38 * dVar39 - dVar36);
  if (base == 1) {
    *local_5b0 = 1;
    if (0 < NCELLS) {
      iVar6 = 1;
      uVar7 = 0;
      iVar9 = 1;
      do {
        lVar4 = 0;
        lVar8 = 0;
        pdVar10 = &local_4f8;
        do {
          lVar12 = 0;
          iVar11 = iVar6;
          do {
            if (lVar4 == lVar12) {
              colVals[(long)iVar9 + -1] = (int)uVar7 * 10 + 1 + (int)lVar8;
LAB_00137599:
              iVar9 = iVar9 + 1;
            }
            else if ((*(double *)((long)pdVar10 + lVar12) != 0.0) ||
                    (NAN(*(double *)((long)pdVar10 + lVar12)))) {
              colVals[(long)iVar9 + -1] = iVar11;
              goto LAB_00137599;
            }
            lVar12 = lVar12 + 0x50;
            iVar11 = iVar11 + 1;
          } while (lVar12 != 800);
          local_5b0[uVar7 * 10 + lVar8 + 1] = iVar9;
          lVar8 = lVar8 + 1;
          lVar4 = lVar4 + 0x50;
          pdVar10 = pdVar10 + 1;
        } while (lVar8 != 10);
        uVar7 = uVar7 + 1;
        iVar6 = iVar6 + 10;
      } while (uVar7 != (uint)NCELLS);
    }
  }
  else {
    *local_5b0 = 0;
    if (0 < NCELLS) {
      iVar6 = 0;
      uVar7 = 0;
      iVar9 = 0;
      do {
        lVar4 = 0;
        lVar8 = 0;
        pdVar10 = &local_4f8;
        do {
          lVar12 = 0;
          iVar11 = iVar6;
          do {
            if (lVar4 == lVar12) {
              colVals[iVar9] = (int)lVar8 + (int)uVar7 * 10;
LAB_00137649:
              iVar9 = iVar9 + 1;
            }
            else if ((*(double *)((long)pdVar10 + lVar12) != 0.0) ||
                    (NAN(*(double *)((long)pdVar10 + lVar12)))) {
              colVals[iVar9] = iVar11;
              goto LAB_00137649;
            }
            lVar12 = lVar12 + 0x50;
            iVar11 = iVar11 + 1;
          } while (lVar12 != 800);
          local_5b0[uVar7 * 10 + lVar8 + 1] = iVar9;
          lVar8 = lVar8 + 1;
          lVar4 = lVar4 + 0x50;
          pdVar10 = pdVar10 + 1;
        } while (lVar8 != 10);
        uVar7 = uVar7 + 1;
        iVar6 = iVar6 + 10;
      } while (uVar7 != (uint)NCELLS);
    }
  }
  return;
}

Assistant:

void
SPARSITY_PREPROC_SYST_CSR(
  int* colVals, int* rowPtr, const int* consP, int NCELLS, int base)
{
  amrex::GpuArray<amrex::Real, 100> Jac = {0.0};
  amrex::GpuArray<amrex::Real, 9> conc = {0.0};
  for (int n = 0; n < 9; n++) {
    conc[n] = 1.0 / 9.000000;
  }
  aJacobian(&Jac[0], &conc[0], 1500.0, *consP);

  if (base == 1) {
    rowPtr[0] = 1;
    int nJdata_tmp = 1;
    for (int nc = 0; nc < NCELLS; nc++) {
      int offset = nc * 10;
      for (int l = 0; l < 10; l++) {
        for (int k = 0; k < 10; k++) {
          if (k == l) {
            colVals[nJdata_tmp - 1] = l + 1 + offset;
            nJdata_tmp = nJdata_tmp + 1;
          } else {
            if (Jac[10 * k + l] != 0.0) {
              colVals[nJdata_tmp - 1] = k + 1 + offset;
              nJdata_tmp = nJdata_tmp + 1;
            }
          }
        }
        rowPtr[offset + (l + 1)] = nJdata_tmp;
      }
    }
  } else {
    rowPtr[0] = 0;
    int nJdata_tmp = 0;
    for (int nc = 0; nc < NCELLS; nc++) {
      int offset = nc * 10;
      for (int l = 0; l < 10; l++) {
        for (int k = 0; k < 10; k++) {
          if (k == l) {
            colVals[nJdata_tmp] = l + offset;
            nJdata_tmp = nJdata_tmp + 1;
          } else {
            if (Jac[10 * k + l] != 0.0) {
              colVals[nJdata_tmp] = k + offset;
              nJdata_tmp = nJdata_tmp + 1;
            }
          }
        }
        rowPtr[offset + (l + 1)] = nJdata_tmp;
      }
    }
  }
}